

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_ternary_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *restype,uint32_t select,
          uint32_t true_value,uint32_t false_value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string local_158;
  string local_138;
  string local_118;
  uint local_f4;
  undefined1 local_f0 [4];
  uint32_t i;
  CompilerGLSL *local_d0;
  anon_class_8_1_8991fb9c swiz;
  string local_a8;
  string local_88;
  string local_68;
  SPIRType *local_38;
  SPIRType *lerptype;
  uint32_t local_28;
  uint32_t false_value_local;
  uint32_t true_value_local;
  uint32_t select_local;
  SPIRType *restype_local;
  CompilerGLSL *this_local;
  string *expr;
  
  lerptype._3_1_ = 0;
  lerptype._4_4_ = false_value;
  local_28 = true_value;
  false_value_local = select;
  _true_value_local = restype;
  restype_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38 = Compiler::expression_type(&this->super_Compiler,false_value_local);
  if (local_38->vecsize == 1) {
    to_enclosed_expression_abi_cxx11_(&local_88,this,false_value_local,true);
    to_enclosed_pointer_expression_abi_cxx11_(&local_a8,this,local_28,true);
    to_enclosed_pointer_expression_abi_cxx11_((string *)&swiz,this,lerptype._4_4_,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
              (&local_68,(spirv_cross *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66a8f1,
               (char (*) [4])&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x68bfe3,
               (char (*) [4])&swiz,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&swiz);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    local_d0 = this;
    type_to_glsl_constructor_abi_cxx11_((string *)local_f0,this,_true_value_local);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f0);
    ::std::__cxx11::string::~string((string *)local_f0);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
    for (local_f4 = 0; local_f4 < _true_value_local->vecsize; local_f4 = local_f4 + 1) {
      to_ternary_expression[abi:cxx11](spirv_cross::SPIRType_const&,unsigned_int,unsigned_int,unsigned_int)
      ::$_0::operator()[abi_cxx11_(&local_118,&local_d0,false_value_local,local_f4);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ? ");
      to_ternary_expression[abi:cxx11](spirv_cross::SPIRType_const&,unsigned_int,unsigned_int,unsigned_int)
      ::$_0::operator()[abi_cxx11_(&local_138,&local_d0,local_28,local_f4);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__," : ");
      to_ternary_expression[abi:cxx11](spirv_cross::SPIRType_const&,unsigned_int,unsigned_int,unsigned_int)
      ::$_0::operator()[abi_cxx11_(&local_158,&local_d0,lerptype._4_4_,local_f4);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_158);
      ::std::__cxx11::string::~string((string *)&local_158);
      if (local_f4 + 1 < _true_value_local->vecsize) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_ternary_expression(const SPIRType &restype, uint32_t select, uint32_t true_value,
                                           uint32_t false_value)
{
	string expr;
	auto &lerptype = expression_type(select);

	if (lerptype.vecsize == 1)
		expr = join(to_enclosed_expression(select), " ? ", to_enclosed_pointer_expression(true_value), " : ",
		            to_enclosed_pointer_expression(false_value));
	else
	{
		auto swiz = [this](uint32_t expression, uint32_t i) { return to_extract_component_expression(expression, i); };

		expr = type_to_glsl_constructor(restype);
		expr += "(";
		for (uint32_t i = 0; i < restype.vecsize; i++)
		{
			expr += swiz(select, i);
			expr += " ? ";
			expr += swiz(true_value, i);
			expr += " : ";
			expr += swiz(false_value, i);
			if (i + 1 < restype.vecsize)
				expr += ", ";
		}
		expr += ")";
	}

	return expr;
}